

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O1

error_t ArgumentHandlers::perseusbelief_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  int iVar2;
  float fVar3;
  
  pvVar1 = state->input;
  if (key < 0x6e) {
    if (key == 0x42) {
      *(undefined4 *)((long)pvVar1 + 0x104) = 1;
    }
    else if (key == 0x48) {
      iVar2 = atoi(arg);
      *(int *)((long)pvVar1 + 0x108) = iVar2;
    }
    else {
      if (key != 0x51) {
        return 7;
      }
      *(undefined4 *)((long)pvVar1 + 0x10c) = 1;
    }
  }
  else {
    if (key == 0x78) {
      fVar3 = strtof(arg,(char **)0x0);
      *(double *)((long)pvVar1 + 0x110) = (double)fVar3;
      return 0;
    }
    if (key == 0x75) {
      *(undefined4 *)((long)pvVar1 + 0xfc) = 1;
    }
    else {
      if (key != 0x6e) {
        return 7;
      }
      iVar2 = atoi(arg);
      *(int *)((long)pvVar1 + 0x100) = iVar2;
    }
  }
  return 0;
}

Assistant:

error_t
perseusbelief_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case 'n':
        theArgumentsStruc->nrBeliefs = atoi(arg);
        break;
    case 'B':
        theArgumentsStruc->saveBeliefs=1;
        break;
    case 'H':
        theArgumentsStruc->resetAfter = atoi(arg);
        break;
    case 'u':
        theArgumentsStruc->uniqueBeliefs=1;
        break;
    case 'Q':
        theArgumentsStruc->useQMDPforSamplingBeliefs=1;
        break;
    case 'x':
        theArgumentsStruc->QMDPexploreProb = strtof(arg,0);
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}